

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seed.cpp
# Opt level: O0

Seed __thiscall jbcoin::generateSeed(jbcoin *this,string *passPhrase)

{
  basic_sha512_half_hasher *this_00;
  void *data;
  size_t size;
  const_pointer data_00;
  undefined8 extraout_RDX;
  Seed SVar1;
  Slice local_120;
  undefined1 local_110 [8];
  result_type digest;
  sha512_half_hasher_s h;
  string *passPhrase_local;
  
  this_00 = (basic_sha512_half_hasher *)(digest.pn + 6);
  detail::basic_sha512_half_hasher<true>::basic_sha512_half_hasher
            ((basic_sha512_half_hasher<true> *)this_00);
  data = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  detail::basic_sha512_half_hasher<true>::operator()
            ((basic_sha512_half_hasher<true> *)this_00,data,size);
  detail::basic_sha512_half_hasher::operator_cast_to_base_uint((result_type *)local_110,this_00);
  data_00 = base_uint<256UL,_void>::data((result_type *)local_110);
  Slice::Slice(&local_120,data_00,0x10);
  Seed::Seed((Seed *)this,&local_120);
  detail::basic_sha512_half_hasher<true>::~basic_sha512_half_hasher
            ((basic_sha512_half_hasher<true> *)(digest.pn + 6));
  SVar1.buf_._M_elems[8] = (char)extraout_RDX;
  SVar1.buf_._M_elems[9] = (char)((ulong)extraout_RDX >> 8);
  SVar1.buf_._M_elems[10] = (char)((ulong)extraout_RDX >> 0x10);
  SVar1.buf_._M_elems[0xb] = (char)((ulong)extraout_RDX >> 0x18);
  SVar1.buf_._M_elems[0xc] = (char)((ulong)extraout_RDX >> 0x20);
  SVar1.buf_._M_elems[0xd] = (char)((ulong)extraout_RDX >> 0x28);
  SVar1.buf_._M_elems[0xe] = (char)((ulong)extraout_RDX >> 0x30);
  SVar1.buf_._M_elems[0xf] = (char)((ulong)extraout_RDX >> 0x38);
  SVar1.buf_._M_elems._0_8_ = this;
  return (Seed)SVar1.buf_._M_elems;
}

Assistant:

Seed
generateSeed (std::string const& passPhrase)
{
    sha512_half_hasher_s h;
    h(passPhrase.data(), passPhrase.size());
    auto const digest =
        sha512_half_hasher::result_type(h);
    return Seed({ digest.data(), 16 });
}